

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scomplex.c
# Opt level: O0

singlecomplex c_sgn(singlecomplex *z)

{
  singlecomplex sVar1;
  float fVar2;
  double dVar3;
  float t;
  singlecomplex *z_local;
  singlecomplex retval;
  
  dVar3 = c_abs(z);
  fVar2 = (float)dVar3;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    z_local._0_4_ = z->r / fVar2;
    z_local._4_4_ = z->i / fVar2;
  }
  else {
    z_local._0_4_ = 1.0;
    z_local._4_4_ = 0.0;
  }
  sVar1.i = z_local._4_4_;
  sVar1.r = z_local._0_4_;
  return sVar1;
}

Assistant:

singlecomplex c_sgn(singlecomplex *z)
{
    register float t = c_abs(z);
    register singlecomplex retval;

    if (t == 0.0) {
	retval.r = 1.0, retval.i = 0.0;
    } else {
	retval.r = z->r / t, retval.i = z->i / t;
    }

    return retval;
}